

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O3

int __thiscall
raptor::TcpServer::GetPeerString(TcpServer *this,ConnectionId cid,char *buf,int buf_len)

{
  int iVar1;
  shared_ptr<raptor::Connection> con;
  IAcceptor local_28;
  IEpollReceiver local_20;
  
  iVar1 = -1;
  if ((((cid != 0xffffffffffffffff) && (this->_magic_number == (uint16_t)(cid >> 0x30))) &&
      ((int)cid != -1)) && ((cid & 0xffffffff) < (this->_options).max_connections)) {
    GetConnection((TcpServer *)&stack0xffffffffffffffd8,(uint32_t)this);
    if ((Connection *)local_28._vptr_IAcceptor == (Connection *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = Connection::GetPeerString((Connection *)local_28._vptr_IAcceptor,buf,buf_len);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._vptr_IEpollReceiver !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._vptr_IEpollReceiver);
    }
  }
  return iVar1;
}

Assistant:

int TcpServer::GetPeerString(ConnectionId cid, char* buf, int buf_len) {
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        return -1;
    }

    auto con = GetConnection(index);
    if (con) {
        return con->GetPeerString(buf, buf_len);
    }
    return -1;
}